

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::RenderTex2DCase::iterate(RenderTex2DCase *this)

{
  RenderContext *context;
  anon_unknown_1 *this_00;
  bool bVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  ProgramSources *pPVar3;
  long lVar4;
  TestError *this_01;
  long lVar5;
  ShaderProgram *result_00;
  int rectNdx;
  long lVar6;
  char *description;
  unsigned_short uVar7;
  int iVar8;
  unsigned_short uVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  int iVar14;
  float fVar15;
  undefined1 auVar13 [16];
  float fVar16;
  float fVar18;
  undefined1 auVar17 [16];
  allocator<char> local_2fa;
  allocator<char> local_2f9;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> rects;
  Texture depthStencilTex;
  undefined1 local_278 [8];
  IndexType local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  Renderbuffer colorBuf;
  Framebuffer fbo;
  TextureLevel reference;
  TextureLevel result;
  ShaderProgram program;
  VertexArrayBinding posBinding;
  Functions *gl;
  undefined4 extraout_var_00;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper(&fbo,context);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(&colorBuf,context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper(&depthStencilTex,context);
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2100000008;
  tcu::TextureLevel::TextureLevel(&result,(TextureFormat *)&program,0x75,0xc1,1);
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1e00000013;
  tcu::TextureLevel::TextureLevel(&reference,(TextureFormat *)&program,0x75,0xc1,1);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  (*gl->bindRenderbuffer)(0x8d41,colorBuf.super_ObjectWrapper.m_object);
  (*gl->renderbufferStorage)(0x8d41,0x8236,0x75,0xc1);
  (*gl->bindTexture)(0xde1,depthStencilTex.super_ObjectWrapper.m_object);
  (*gl->texStorage2D)(0xde1,1,this->m_format,0x75,0xc1);
  (*gl->bindFramebuffer)(0x8d40,fbo.super_ObjectWrapper.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,colorBuf.super_ObjectWrapper.m_object);
  (*gl->framebufferTexture2D)(0x8d40,0x821a,0xde1,depthStencilTex.super_ObjectWrapper.m_object,0);
  checkFramebufferStatus(gl);
  memset(&posBinding,0,0xac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&positions,
             "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_2fa);
  glu::VertexSource::VertexSource((VertexSource *)local_278,(string *)&positions);
  pPVar3 = glu::ProgramSources::operator<<((ProgramSources *)&posBinding,(ShaderSource *)local_278);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&indices,"#version 300 es\nvoid main (void) {}\n",&local_2f9);
  glu::FragmentSource::FragmentSource((FragmentSource *)&rects,(string *)&indices);
  pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)&rects);
  glu::ShaderProgram::ShaderProgram(&program,context,pPVar3);
  std::__cxx11::string::~string
            ((string *)
             &rects.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&indices);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&positions);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&posBinding);
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  lVar4 = CONCAT44(extraout_var_00,iVar2);
  rects.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rects.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  rects.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (program.m_program.m_info.linkOk != false) {
    (**(code **)(lVar4 + 0x1680))(program.m_program.m_program);
    (**(code **)(lVar4 + 0x1a00))(0,0,0x75,0xc1);
    (**(code **)(lVar4 + 0x188))(0x400);
    (**(code **)(lVar4 + 0x5e0))(0xb90);
    (**(code **)(lVar4 + 0x12e8))(0x1e00,0x1e00,0x8507);
    (**(code **)(lVar4 + 0x12c8))(0x207,0,0xffffffffffffffff);
    err = (**(code **)(lVar4 + 0x800))();
    glu::checkError(err,"State setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                    ,0x97);
    genTestRects(&rects,0x75,0xc1);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
              (&positions,
               (long)rects.
                     super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)rects.
                     super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              (&indices,((long)rects.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)rects.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4) * 6);
    iVar2 = 5;
    lVar5 = 0;
    for (lVar6 = 0;
        lVar6 < (int)((ulong)((long)rects.
                                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)rects.
                                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
        lVar6 = lVar6 + 1) {
      iVar11 = (int)*(undefined8 *)
                     ((rects.
                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar5);
      iVar14 = (int)((ulong)*(undefined8 *)
                             ((rects.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar5) >> 0x20);
      auVar13._0_4_ = (float)(iVar11 * 2);
      auVar13._4_4_ = (float)(iVar14 * 2);
      auVar13._8_8_ = 0;
      auVar13 = divps(auVar13,ZEXT816(0x4341000042ea0000));
      fVar12 = auVar13._0_4_ + -1.0;
      fVar15 = auVar13._4_4_ + -1.0;
      iVar8 = (int)(lVar5 + 1);
      iVar10 = (int)(lVar5 + 2);
      auVar17._0_4_ =
           (float)(((int)*(undefined8 *)
                          ((rects.
                            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar5 + 2) + iVar11
                   ) * 2);
      auVar17._4_4_ =
           (float)(((int)((ulong)*(undefined8 *)
                                  ((rects.
                                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar5 + 2)
                         >> 0x20) + iVar14) * 2);
      auVar17._8_8_ = 0;
      auVar13 = divps(auVar17,ZEXT816(0x4341000042ea0000));
      fVar16 = auVar13._0_4_ + -1.0;
      fVar18 = auVar13._4_4_ + -1.0;
      *(ulong *)positions.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_start[(int)lVar5].m_data =
           CONCAT44(fVar15,fVar12);
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar8].m_data[0] = fVar16;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar8].m_data[1] = fVar15;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar10].m_data[0] = fVar12;
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar10].m_data[1] = fVar18;
      *(ulong *)positions.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_start[(int)(lVar5 + 3)].m_data =
           CONCAT44(fVar18,fVar16);
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2 + -5] = (unsigned_short)lVar5;
      uVar7 = (unsigned_short)(lVar5 + 1);
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2 + -4] = uVar7;
      uVar9 = (unsigned_short)(lVar5 + 2);
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2 + -3] = uVar9;
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2 + -2] = uVar9;
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2 + -1] = uVar7;
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2] = (unsigned_short)(lVar5 + 3);
      iVar2 = iVar2 + 6;
      lVar5 = lVar5 + 4;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_278,"a_position",&local_2fa);
    glu::va::Float(&posBinding,(string *)local_278,2,
                   (int)((ulong)((long)positions.
                                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)positions.
                                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3),0,
                   (positions.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_data);
    std::__cxx11::string::~string((string *)local_278);
    local_278._0_4_ = SHADERTYPE_VERTEX;
    local_278._4_4_ =
         (undefined4)
         ((ulong)((long)indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 1);
    local_270 = INDEXTYPE_UINT16;
    local_268._M_allocated_capacity =
         (size_type)
         indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_start;
    glu::draw(context,program.m_program.m_program,1,&posBinding,(PrimitiveList *)local_278,
              (DrawUtilCallback *)0x0);
    std::__cxx11::string::~string((string *)&posBinding.binding.name);
    (**(code **)(lVar4 + 0x4e8))(0xb90);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              (&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
    std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
              (&positions.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
    std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
              (&rects.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
              );
    glu::ShaderProgram::~ShaderProgram(&program);
    (*gl->framebufferRenderbuffer)(0x8d40,0x821a,0x8d41,0);
    checkFramebufferStatus(gl);
    blitStencilToColor2D(context,depthStencilTex.super_ObjectWrapper.m_object,0x75,0xc1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&program,&result);
    result_00 = &program;
    glu::readPixels(context,0,0,(PixelBufferAccess *)result_00);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&program,&reference);
    renderTestPatternReference((PixelBufferAccess *)&program);
    this_00 = (anon_unknown_1 *)
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&program,&reference);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&posBinding,&result);
    bVar1 = compareStencilToRed(this_00,(TestLog *)&program,(ConstPixelBufferAccess *)&posBinding,
                                (ConstPixelBufferAccess *)result_00);
    description = "Image comparison failed";
    if (bVar1) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,
               description);
    tcu::TextureLevel::~TextureLevel(&reference);
    tcu::TextureLevel::~TextureLevel(&result);
    glu::ObjectWrapper::~ObjectWrapper(&depthStencilTex.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper(&colorBuf.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
    return STOP;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&posBinding,"Compile failed",(allocator<char> *)local_278);
  tcu::TestError::TestError(this_01,(string *)&posBinding);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx		= m_context.getRenderContext();
		const glw::Functions&		gl				= renderCtx.getFunctions();
		const int					width			= 117;
		const int					height			= 193;
		glu::Framebuffer			fbo				(renderCtx);
		glu::Renderbuffer			colorBuf		(renderCtx);
		glu::Texture				depthStencilTex	(renderCtx);
		TextureLevel				result			(TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT32), width, height);
		TextureLevel				reference		(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8), width, height);

		checkDepthStencilFormatSupport(m_context, m_format);

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, width, height);

		gl.bindTexture(GL_TEXTURE_2D, *depthStencilTex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, m_format, width, height);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_TEXTURE_2D, *depthStencilTex, 0);
		checkFramebufferStatus(gl);

		drawTestPattern(renderCtx, width, height);

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_RENDERBUFFER, 0);
		checkFramebufferStatus(gl);

		blitStencilToColor2D(renderCtx, *depthStencilTex, width, height);
		glu::readPixels(renderCtx, 0, 0, result.getAccess());

		renderTestPatternReference(reference);

		{
			const bool compareOk = compareStencilToRed(m_testCtx.getLog(), reference, result);
			m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
									compareOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}